

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::addRelation
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Type type,Bucket *rt,
          Relations *maybeBetween)

{
  pointer prVar1;
  pointer prVar2;
  bool bVar3;
  Type TVar4;
  Type TVar5;
  Bucket *pBVar6;
  long lVar7;
  Relations *maybeBetween_00;
  Relations between;
  BucketSet intersect;
  
  maybeBetween_00 = &between;
  between = fromMaybeBetween(this,lt,rt,maybeBetween);
  bVar3 = areRelated(this,lt,type,rt,&between);
  if (bVar3) {
    return false;
  }
  pBVar6 = rt;
  switch(type) {
  case EQ:
    prVar1 = (lt->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((prVar1 != (lt->relatedBuckets)._M_elems[10].vec.
                   super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
       (prVar2 = (rt->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       prVar2 != (rt->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      addRelation(this,prVar1->_M_data,EQ,prVar2->_M_data,(Relations *)0x0);
    }
    bVar3 = setEqual(this,lt,rt);
    return bVar3;
  case NE:
    intersect.vec.
    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x500000003;
    intersect.vec.
    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x900000007;
    lVar7 = 0;
    do {
      if (lVar7 == 0x10) goto switchD_00138ea4_default;
      TVar4 = *(Type *)((long)&intersect.vec.
                               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar7);
      bVar3 = areRelated(this,lt,TVar4,rt,(Relations *)0x0);
      if (bVar3) {
        return false;
      }
      TVar5 = dg::vr::Relations::getNonStrict(TVar4);
      bVar3 = areRelated(this,lt,TVar5,rt,&between);
      lVar7 = lVar7 + 4;
    } while (!bVar3);
    TVar5 = dg::vr::Relations::getNonStrict(TVar4);
    unsetRelated(lt,TVar5,rt);
    break;
  case SLE:
  case ULE:
    bVar3 = areRelated(this,lt,NE,rt,&between);
    if (!bVar3) {
      TVar4 = dg::vr::Relations::inverted(type);
      bVar3 = areRelated(this,lt,TVar4,rt,&between);
      if (bVar3) {
        TVar4 = dg::vr::Relations::inverted(type);
        getIntersectingNonstrict(&intersect,this,lt,rt,TVar4);
        pBVar6 = (intersect.vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_data;
        while (intersect.vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_start =
                    intersect.vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 1,
              intersect.vec.
              super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              intersect.vec.
              super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
          setEqual(this,pBVar6,
                   (intersect.vec.
                    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_data);
        }
        std::
        _Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
        ::~_Vector_base((_Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                         *)&intersect);
        return true;
      }
      goto switchD_00138ea4_default;
    }
    unsetRelated(lt,NE,rt);
    TVar4 = dg::vr::Relations::getStrict(type);
    maybeBetween_00 = &between;
    break;
  case SLT:
  case ULT:
    TVar4 = dg::vr::Relations::getNonStrict(type);
    bVar3 = areRelated(this,lt,TVar4,rt,&between);
    if (bVar3) {
      TVar4 = dg::vr::Relations::getNonStrict(type);
      unsetRelated(lt,TVar4,rt);
    }
    bVar3 = areRelated(this,lt,NE,rt,&between);
    if (bVar3) {
      unsetRelated(lt,NE,rt);
    }
  default:
switchD_00138ea4_default:
    setRelated(lt,type,rt);
    return true;
  case SGE:
  case SGT:
  case UGE:
  case UGT:
  case PF:
    dg::vr::Relations::invert();
    TVar4 = dg::vr::Relations::inverted(type);
    pBVar6 = lt;
    lt = rt;
    maybeBetween_00 = &between;
    break;
  case PT:
    prVar1 = (lt->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar1 == (lt->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto switchD_00138ea4_default;
    lt = prVar1->_M_data;
    TVar4 = EQ;
    maybeBetween_00 = (Relations *)0x0;
  }
  bVar3 = addRelation(this,lt,TVar4,pBVar6,maybeBetween_00);
  return bVar3;
}

Assistant:

bool addRelation(const Bucket &lt, Relations::Type type, const Bucket &rt,
                     Relations *maybeBetween = nullptr) {
        Bucket &mLt = const_cast<Bucket &>(lt);
        Bucket &mRt = const_cast<Bucket &>(rt);

        Relations between = fromMaybeBetween(lt, rt, maybeBetween);
        if (areRelated(lt, type, rt, &between))
            return false;
        assert(!haveConflictingRelation(lt, type, rt, &between));

        switch (type) {
        case Relations::EQ:
            if (lt.hasRelation(Relations::PT) &&
                rt.hasRelation(Relations::PT)) {
                addRelation(lt.getRelated(Relations::PT), Relations::EQ,
                            rt.getRelated(Relations::PT));
            }
            return setEqual(mLt, mRt);

        case Relations::NE:
            for (Relations::Type rel : {Relations::SLT, Relations::ULT,
                                        Relations::SGT, Relations::UGT}) {
                if (areRelated(lt, rel, rt))
                    return false;
                if (areRelated(lt, Relations::getNonStrict(rel), rt,
                               &between)) {
                    unsetRelated(mLt, Relations::getNonStrict(rel), mRt);
                    return addRelation(lt, rel, rt, &between);
                }
            }
            break; // jump after switch

        case Relations::SLT:
        case Relations::ULT:
            if (areRelated(lt, Relations::getNonStrict(type), rt, &between))
                unsetRelated(mLt, Relations::getNonStrict(type), mRt);
            if (areRelated(lt, Relations::NE, rt, &between))
                unsetRelated(mLt, Relations::NE, mRt);
            break; // jump after switch

        case Relations::SLE:
        case Relations::ULE:
            if (areRelated(lt, Relations::NE, rt, &between)) {
                unsetRelated(mLt, Relations::NE, mRt);
                return addRelation(lt, Relations::getStrict(type), rt,
                                   &between);
            }
            if (areRelated(lt, Relations::inverted(type), rt, &between)) {
                Bucket::BucketSet intersect = getIntersectingNonstrict(
                        lt, rt, Relations::inverted(type));
                assert(intersect.size() >= 2);
                Bucket &first = *intersect.begin();
                for (auto it = std::next(intersect.begin());
                     it != intersect.end(); ++it)
                    setEqual(first, *it);
                return true;
            }
            break; // jump after switch

        case Relations::PT:
            if (lt.hasRelation(type))
                return addRelation(lt.getRelated(type), Relations::EQ, rt);
            break; // jump after switch

        case Relations::SGT:
        case Relations::SGE:
        case Relations::UGT:
        case Relations::UGE:
        case Relations::PF: {
            between.invert();
            return addRelation(rt, Relations::inverted(type), lt, &between);
        }
        }
        setRelated(mLt, type, mRt);
        return true;
    }